

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_>::build
          (BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_> *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  BVH *pBVar5;
  pointer ppTVar6;
  Device *pDVar7;
  Block *pBVar8;
  PrimRef *pPVar9;
  MemoryMonitorInterface *pMVar10;
  Geometry *pGVar11;
  Scene *pSVar12;
  GTypeMask GVar13;
  BVHN<4> *this_00;
  double dVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  long *plVar19;
  PrimRef *pPVar20;
  NodeRef root;
  uint uVar21;
  long *plVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  ulong numPrimRefs;
  __pointer_type pBVar25;
  pointer ppTVar26;
  size_t sVar27;
  ulong uVar28;
  double t0;
  string __str;
  PrimInfo pinfo;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [3];
  long local_88;
  long local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar5 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar5->alloc);
    ppTVar6 = (pBVar5->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar26 = (pBVar5->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar26 != ppTVar6;
        ppTVar26 = ppTVar26 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar26,&pBVar5->alloc);
    }
    ppTVar26 = (pBVar5->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar5->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar26) {
      (pBVar5->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar26;
    }
    LOCK();
    (pBVar5->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar5->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar25 = (pBVar5->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar25->next;
        FastAllocator::Block::clear_block(pBVar25,pDVar7,bVar4);
        pBVar25 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar5->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar25 = (pBVar5->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar25->next;
        FastAllocator::Block::clear_block(pBVar25,pDVar7,bVar4);
        pBVar25 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar18 = -8;
    do {
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar18]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar18 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
    sVar27 = (pBVar5->alloc).primrefarray.size_alloced;
    pPVar9 = (pBVar5->alloc).primrefarray.items;
    if (pPVar9 != (PrimRef *)0x0) {
      if (sVar27 << 5 < 0x1c00000) {
        alignedFree(pPVar9);
      }
      else {
        os_free(pPVar9,sVar27 << 5,(pBVar5->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar27 != 0) {
      pMVar10 = (pBVar5->alloc).primrefarray.alloc.device;
      (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
    }
    (pBVar5->alloc).primrefarray.size_active = 0;
    (pBVar5->alloc).primrefarray.size_alloced = 0;
    (pBVar5->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  pGVar11 = this->mesh;
  if (pGVar11 == (Geometry *)0x0) {
    pSVar12 = this->scene;
    GVar13 = this->gtype_;
    uVar21 = (uint)GVar13;
    if ((uVar21 >> 0x14 & 1) == 0) {
      numPrimRefs = 0;
    }
    else {
      numPrimRefs = (pSVar12->world).numTriangles;
    }
    if ((uVar21 >> 0x15 & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numQuads;
    }
    if ((GVar13 & MTY_CURVE2) != ~MTY_ALL) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numLineSegments;
    }
    if ((GVar13 & MTY_CURVE4) != ~MTY_ALL) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numBezierCurves;
    }
    if ((GVar13 & MTY_POINTS) != ~MTY_ALL) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numPoints;
    }
    if ((uVar21 >> 0x17 & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numSubdivPatches;
    }
    if ((uVar21 >> 0x1d & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numUserGeometries;
    }
    if ((uVar21 >> 0x1e & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numInstancesCheap;
    }
    if ((int)uVar21 < 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numInstancesExpensive;
    }
    if ((uVar21 >> 0x18 & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numInstanceArrays;
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      numPrimRefs = numPrimRefs + (pSVar12->world).numGrids;
    }
  }
  else {
    numPrimRefs = (ulong)pGVar11->numPrimitives;
  }
  this->numPreviousPrimitives = (uint)numPrimRefs;
  if (numPrimRefs != 0) {
    this_00 = this->bvh;
    if (pGVar11 == (Geometry *)0x0) {
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct((ulong)local_e8,'\x01');
      *local_e8[0] = 0x34;
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x2026f98);
      local_108 = &local_f8;
      plVar22 = plVar19 + 2;
      if ((long *)*plVar19 == plVar22) {
        local_f8 = *plVar22;
        lStack_f0 = plVar19[3];
      }
      else {
        local_f8 = *plVar22;
        local_108 = (long *)*plVar19;
      }
      local_100 = plVar19[1];
      *plVar19 = (long)plVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_c8._0_8_ = local_b8;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 == paVar23) {
        local_b8[0]._0_8_ = paVar23->_M_allocated_capacity;
        local_b8[0]._8_8_ = plVar19[3];
      }
      else {
        local_b8[0]._0_8_ = paVar23->_M_allocated_capacity;
        local_c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar19;
      }
      local_c8._8_8_ = plVar19[1];
      *plVar19 = (long)paVar23;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
    }
    else {
      local_c8._0_8_ = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    }
    t0 = BVHN<4>::preBuild(this_00,(string *)&local_c8.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ != local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (pGVar11 == (Geometry *)0x0) {
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
    }
    uVar24 = (this->prims).size_alloced;
    uVar28 = uVar24;
    if ((uVar24 < numPrimRefs) && (uVar28 = numPrimRefs, uVar24 != 0)) {
      while (uVar28 = uVar24, uVar28 < numPrimRefs) {
        uVar24 = uVar28 * 2 + (ulong)(uVar28 * 2 == 0);
      }
    }
    psVar1 = &(this->prims).size_active;
    if (numPrimRefs < (this->prims).size_active) {
      *psVar1 = numPrimRefs;
    }
    prims = &this->prims;
    if ((this->prims).size_alloced == uVar28) {
      *psVar1 = numPrimRefs;
    }
    else {
      pPVar9 = (this->prims).items;
      if (uVar28 != 0) {
        pMVar10 = (prims->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar28 << 5,0);
      }
      sVar27 = uVar28 << 5;
      if (sVar27 < 0x1c00000) {
        pPVar20 = (PrimRef *)alignedMalloc(sVar27,0x20);
      }
      else {
        pPVar20 = (PrimRef *)os_malloc(sVar27,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar20;
      if ((this->prims).size_active != 0) {
        lVar18 = 0;
        uVar24 = 0;
        do {
          puVar2 = (undefined8 *)((long)&(pPVar9->lower).field_0 + lVar18);
          uVar15 = puVar2[1];
          uVar16 = puVar2[2];
          uVar17 = puVar2[3];
          puVar3 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar18);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          puVar3[2] = uVar16;
          puVar3[3] = uVar17;
          uVar24 = uVar24 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar24 < (this->prims).size_active);
      }
      sVar27 = (this->prims).size_alloced;
      if (pPVar9 != (PrimRef *)0x0) {
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar27 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar10 = (prims->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
      }
      (this->prims).size_active = numPrimRefs;
      (this->prims).size_alloced = uVar28;
    }
    if (this->mesh == (Geometry *)0x0) {
      avx::createPrimRefArray
                ((PrimInfo *)&local_c8.field_1,this->scene,this->gtype_,false,numPrimRefs,prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      avx::createPrimRefArray
                ((PrimInfo *)&local_c8.field_1,this->mesh,this->geomID_,numPrimRefs,prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    if (this->mesh != (Geometry *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    dVar14 = (double)(numPrimRefs + 3 >> 2) * 1.2 * 224.0;
    uVar24 = (ulong)dVar14;
    sVar27 = ((long)(dVar14 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24) +
             (numPrimRefs * 0x50 >> 4);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar27);
    sVar27 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,numPrimRefs,sVar27);
    (this->settings).singleThreadThreshold = sVar27;
    local_78._8_8_ = this->bvh;
    local_78._0_8_ = &PTR_createLeaf_02213358;
    root = BVHNBuilderQuantizedVirtual<4>::BVHNBuilderV::build
                     ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                      &(((BVH *)local_78._8_8_)->scene->progressInterface).
                       super_BuildProgressMonitor,(this->prims).items,(PrimInfo *)&local_c8.field_1,
                      this->settings);
    local_78._0_8_ = local_c8._0_8_;
    local_78._8_8_ = local_c8._8_8_;
    local_68._0_8_ = local_b8[0]._M_allocated_capacity;
    local_68._8_8_ = local_b8[0]._8_8_;
    local_58._0_8_ = local_c8._0_8_;
    local_58._8_8_ = local_c8._8_8_;
    local_48._0_8_ = local_b8[0]._M_allocated_capacity;
    local_48._8_8_ = local_b8[0]._8_8_;
    BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,local_80 - local_88);
    if ((this->scene != (Scene *)0x0) &&
       ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
      sVar27 = (this->prims).size_alloced;
      pPVar9 = (this->prims).items;
      if (pPVar9 != (PrimRef *)0x0) {
        root.ptr = sVar27 << 5;
        if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,root.ptr,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar10 = (prims->alloc).device;
        root.ptr = sVar27 * -0x20;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,root.ptr,1);
      }
      *psVar1 = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
    }
    BVHN<4>::cleanup(this->bvh,(EVP_PKEY_CTX *)root.ptr);
    BVHN<4>::postBuild(this->bvh,t0);
    return;
  }
  sVar27 = (this->prims).size_alloced;
  pPVar9 = (this->prims).items;
  if (pPVar9 != (PrimRef *)0x0) {
    if (sVar27 << 5 < 0x1c00000) {
      alignedFree(pPVar9);
    }
    else {
      os_free(pPVar9,sVar27 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar27 != 0) {
    pMVar10 = (this->prims).alloc.device;
    (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar27 * -0x20,1);
  }
  (this->prims).size_active = 0;
  (this->prims).size_alloced = 0;
  (this->prims).items = (PrimRef *)0x0;
  (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          prims.clear();
          bvh->clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::QBVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif
            /* create primref array */
            prims.resize(numPrimitives);
            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* call BVH builder */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::QuantizedNode)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            NodeRef root = BVHNBuilderQuantizedVirtual<N>::build(&bvh->alloc,CreateLeafQuantized<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            //bvh->layoutLargeNodes(pinfo.size()*0.005f); // FIXME: COPY LAYOUT FOR LARGE NODES !!!
#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }